

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-regex.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *find_text;
  char *line;
  strbuffer_t buffer;
  char *regex_text;
  char **ppcStack_18;
  int eof;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  buffer._16_8_ = anon_var_dwarf_23;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    strbuffer_init((strbuffer_t *)&line,0x50,10);
    find_text = strbuffer_getline((strbuffer_t *)&line,(int *)((long)&regex_text + 4));
    process_regex(find_text,(char *)buffer._16_8_);
    if (find_text != (char *)0x0) {
      free(find_text);
    }
  }
  else {
    process_regex(argv[1],"(\\w+)");
  }
  return 0;
}

Assistant:

int main (int argc, char ** argv)
{
    int eof;
    const char * regex_text = WORD_REGEX;

    // if no arguments read text from stdin; else use argv[1] as text
    if (argc < 2)
    {
        strbuffer_t buffer;
        strbuffer_init(&buffer, 80, 10);
        char* line = strbuffer_getline(&buffer, &eof);
        process_regex(line, regex_text);
        if (line) free(line);
    }
    else
    {
        process_regex(argv[1], regex_text);
    }
    return 0;
}